

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTDMT_compress_advanced_internal
                 (ZSTDMT_CCtx *mtctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,
                 ZSTD_CDict *cdict,ZSTD_CCtx_params params)

{
  void *__dest;
  pthread_mutex_t *__mutex;
  ZSTDMT_seqPool *seqPool;
  ulong __n;
  ZSTD_CCtx *cctx;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ZSTD_CCtx_params params_00;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  buffer_t *pbVar9;
  ZSTDMT_jobDescription *pZVar10;
  unsigned_long_long uVar11;
  uint uVar12;
  long lVar13;
  size_t sVar14;
  ZSTD_CDict *pZVar15;
  ulong uVar16;
  long lVar17;
  ZSTD_CCtx_params *pZVar18;
  long lVar19;
  undefined8 *puVar20;
  size_t sVar21;
  uint uVar22;
  ulong uVar23;
  size_t sVar24;
  ulong uVar25;
  ulong uVar26;
  bool bVar27;
  byte bVar28;
  buffer_t buf;
  buffer_t dstAsBuffer;
  buffer_t dstBuffer;
  ZSTD_CCtx_params jobParams;
  undefined8 in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  undefined1 auVar29 [12];
  undefined1 auVar30 [24];
  undefined1 in_stack_fffffffffffffe18 [128];
  undefined1 auVar31 [24];
  buffer_t local_e8;
  void *local_d8;
  size_t sStack_d0;
  ZSTD_CCtx_params local_c0;
  
  bVar28 = 0;
  memcpy(&local_c0,&params,0x90);
  local_c0.forceWindow = 0;
  local_c0._76_8_ = 0;
  local_c0._84_8_ = 0;
  local_c0.rsyncable = 0;
  local_c0.ldmParams.enableLdm = 0;
  local_c0.ldmParams.hashLog = 0;
  local_c0.ldmParams.bucketSizeLog = 0;
  local_c0.ldmParams.minMatchLength = 0;
  local_c0.ldmParams.hashRateLog = 0;
  local_c0._116_8_ = 0;
  local_c0.customMem._4_8_ = 0;
  local_c0.customMem._12_8_ = 0;
  local_c0.customMem.opaque._4_4_ = 0;
  sVar5 = ZSTDMT_computeOverlapSize(&params);
  if ((ulong)(uint)params.nbWorkers == 0) {
    __assert_fail("nbWorkers>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4f2f,
                  "unsigned int ZSTDMT_computeNbJobs(const ZSTD_CCtx_params *, size_t, unsigned int)"
                 );
  }
  if (params.ldmParams.enableLdm == 0) {
    uVar12 = params.cParams.windowLog + 2;
    bVar27 = uVar12 < 0x15;
    uVar22 = 0x14;
  }
  else {
    uVar12 = params.cParams.chainLog + 4;
    bVar27 = uVar12 < 0x16;
    uVar22 = 0x15;
  }
  if (!bVar27) {
    uVar22 = uVar12;
  }
  uVar7 = -(srcSize - 0x20000) >> 0xb;
  if (0x1ffff < srcSize) {
    uVar7 = 0;
  }
  uVar12 = 0x1e;
  if (uVar22 < 0x1e) {
    uVar12 = uVar22;
  }
  uVar3 = (int)(srcSize / ((ulong)(uint)params.nbWorkers << ((byte)uVar12 + 2 & 0x3f))) + 1;
  uVar22 = (int)(srcSize >> ((byte)uVar12 & 0x3f)) + 1;
  if ((uint)params.nbWorkers <= uVar22) {
    uVar22 = params.nbWorkers;
  }
  if (1 < uVar3) {
    uVar22 = uVar3 * params.nbWorkers;
  }
  uVar23 = CONCAT44(0,uVar22);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar23;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (uVar22 - 1) + srcSize;
  uVar6 = SUB168(auVar2 / auVar1,0);
  uVar26 = uVar6 + 0xffff;
  if (0x7ffe < (SUB164(auVar2 / auVar1,0) - 1U & 0x1ffff)) {
    uVar26 = uVar6;
  }
  uVar6 = uVar23;
  if (dstCapacity < (srcSize >> 8) + srcSize + uVar7) {
    uVar7 = -(uVar26 - 0x20000) >> 0xb;
    if (0x1ffff < uVar26) {
      uVar7 = 0;
    }
    uVar6 = dstCapacity / ((uVar26 >> 8) + uVar26 + uVar7);
  }
  if (local_c0.nbWorkers == 0) {
    if (mtctx->cctxPool->totalCCtx != params.nbWorkers) {
      __assert_fail("mtctx->cctxPool->totalCCtx == params.nbWorkers",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4f4e,
                    "size_t ZSTDMT_compress_advanced_internal(ZSTDMT_CCtx *, void *, size_t, const void *, size_t, const ZSTD_CDict *, ZSTD_CCtx_params)"
                   );
    }
    params.jobSize = uVar26 & 0xffffffff;
    if ((params.nbWorkers < 2) || (uVar22 == 1)) {
      cctx = mtctx->cctxPool->cctx[0];
      if (cdict == (ZSTD_CDict *)0x0) {
        uVar7 = ZSTD_compress_advanced_internal
                          (cctx,dst,dstCapacity,src,srcSize,(void *)0x0,0,&local_c0);
      }
      else {
        uVar7 = ZSTD_compressBegin_usingCDict_advanced(cctx,cdict,local_c0.fParams,srcSize);
        if (uVar7 < 0xffffffffffffff89) {
          sVar5 = ZSTD_compressEnd(cctx,dst,dstCapacity,src,srcSize);
          return sVar5;
        }
      }
    }
    else {
      if (uVar26 < 0x40000) {
        __assert_fail("avgJobSize >= 256 KB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x4f5b,
                      "size_t ZSTDMT_compress_advanced_internal(ZSTDMT_CCtx *, void *, size_t, const void *, size_t, const ZSTD_CDict *, ZSTD_CCtx_params)"
                     );
      }
      __mutex = (pthread_mutex_t *)mtctx->bufPool;
      pthread_mutex_lock(__mutex);
      __mutex[1].__align = (uVar26 >> 8) + uVar26;
      pthread_mutex_unlock(__mutex);
      seqPool = mtctx->seqPool;
      pZVar18 = &params;
      puVar20 = (undefined8 *)&stack0xfffffffffffffe08;
      for (lVar13 = 0x12; lVar13 != 0; lVar13 = lVar13 + -1) {
        *puVar20 = *(undefined8 *)pZVar18;
        pZVar18 = (ZSTD_CCtx_params *)((long)pZVar18 + (ulong)bVar28 * -0x10 + 8);
        puVar20 = puVar20 + (ulong)bVar28 * -2 + 1;
      }
      params_00.cParams.chainLog = (int)in_stack_fffffffffffffe10;
      params_00.cParams.hashLog = (int)((ulong)in_stack_fffffffffffffe10 >> 0x20);
      params_00.format = (int)in_stack_fffffffffffffe08;
      params_00.cParams.windowLog = (int)((ulong)in_stack_fffffffffffffe08 >> 0x20);
      auVar29 = in_stack_fffffffffffffe18._16_12_;
      auVar30 = in_stack_fffffffffffffe18._80_24_;
      auVar31 = in_stack_fffffffffffffe18._104_24_;
      params_00.cParams.searchLog = in_stack_fffffffffffffe18._0_4_;
      params_00.cParams.minMatch = in_stack_fffffffffffffe18._4_4_;
      params_00.cParams.targetLength = in_stack_fffffffffffffe18._8_4_;
      params_00.cParams.strategy = in_stack_fffffffffffffe18._12_4_;
      params_00.fParams.contentSizeFlag = auVar29._0_4_;
      params_00.fParams.checksumFlag = auVar29._4_4_;
      params_00.fParams.noDictIDFlag = auVar29._8_4_;
      params_00.compressionLevel = in_stack_fffffffffffffe18._28_4_;
      params_00.forceWindow = in_stack_fffffffffffffe18._32_4_;
      params_00._52_4_ = in_stack_fffffffffffffe18._36_4_;
      params_00.targetCBlockSize = in_stack_fffffffffffffe18._40_8_;
      params_00.srcSizeHint = in_stack_fffffffffffffe18._48_4_;
      params_00.attachDictPref = in_stack_fffffffffffffe18._52_4_;
      params_00.literalCompressionMode = in_stack_fffffffffffffe18._56_4_;
      params_00.nbWorkers = in_stack_fffffffffffffe18._60_4_;
      params_00.jobSize = in_stack_fffffffffffffe18._64_8_;
      params_00.overlapLog = in_stack_fffffffffffffe18._72_4_;
      params_00.rsyncable = in_stack_fffffffffffffe18._76_4_;
      params_00.ldmParams.enableLdm = auVar30._0_4_;
      params_00.ldmParams.hashLog = auVar30._4_4_;
      params_00.ldmParams.bucketSizeLog = auVar30._8_4_;
      params_00.ldmParams.minMatchLength = auVar30._12_4_;
      params_00.ldmParams.hashRateLog = auVar30._16_4_;
      params_00.ldmParams.windowLog = auVar30._20_4_;
      params_00.customMem.customAlloc = (ZSTD_allocFunction)auVar31._0_8_;
      params_00.customMem.customFree = (ZSTD_freeFunction)auVar31._8_8_;
      params_00.customMem.opaque = (void *)auVar31._16_8_;
      iVar4 = ZSTDMT_serialState_reset(&mtctx->serial,seqPool,params_00,uVar26,(void *)0x0,0);
      uVar7 = 0xffffffffffffffc0;
      if ((iVar4 == 0) && (uVar7 = ZSTDMT_expandJobsTable(mtctx,uVar22), uVar7 < 0xffffffffffffff89)
         ) {
        if (uVar22 == 0) {
          uVar26 = 0;
          uVar7 = 0;
        }
        else {
          lVar17 = 0xc0;
          uVar7 = 0;
          lVar13 = 0;
          lVar19 = 0;
          sVar21 = srcSize;
          do {
            uVar25 = uVar26;
            if (sVar21 < uVar26) {
              uVar25 = sVar21;
            }
            uVar8 = -(uVar25 - 0x20000) >> 0xb;
            if (0x1ffff < uVar25) {
              uVar8 = 0;
            }
            sVar24 = (uVar25 >> 8) + uVar25 + uVar8;
            local_e8.start = (void *)((long)dst + lVar19);
            pbVar9 = &g_nullBuffer;
            if (uVar7 < (uVar6 & 0xffffffff)) {
              pbVar9 = &local_e8;
            }
            local_e8.capacity = sVar24;
            local_d8 = pbVar9->start;
            sStack_d0 = pbVar9->capacity;
            sVar14 = sVar5;
            if (uVar7 == 0) {
              sVar14 = 0;
            }
            pZVar10 = mtctx->jobs;
            *(size_t *)((long)pZVar10 + lVar17 + -0x28) = (lVar13 + (long)src) - sVar14;
            *(size_t *)((long)pZVar10 + lVar17 + -0x20) = sVar14;
            *(long *)((long)pZVar10 + lVar17 + -0x18) = lVar13 + (long)src;
            *(ulong *)((long)pZVar10 + lVar17 + -0x10) = uVar25;
            if (sVar21 == 0) {
              __assert_fail("jobSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x4f6d,
                            "size_t ZSTDMT_compress_advanced_internal(ZSTDMT_CCtx *, void *, size_t, const void *, size_t, const ZSTD_CDict *, ZSTD_CCtx_params)"
                           );
            }
            pZVar15 = (ZSTD_CDict *)0x0;
            if (uVar7 == 0) {
              pZVar15 = cdict;
            }
            __dest = (void *)((long)&pZVar10->cSize + lVar17);
            *(undefined1 (*) [16])((long)__dest + -200) = ZEXT816(0) << 0x20;
            *(ZSTD_CDict **)((long)__dest + 0x90) = pZVar15;
            *(size_t *)((long)__dest + 0x98) = srcSize;
            memcpy(__dest,&local_c0,0x90);
            puVar20 = (undefined8 *)((long)mtctx->jobs + lVar17 + -0x38);
            *puVar20 = local_d8;
            puVar20[1] = sStack_d0;
            pZVar10 = mtctx->jobs;
            *(ZSTDMT_CCtxPool **)((long)pZVar10 + lVar17 + -0x58) = mtctx->cctxPool;
            *(ZSTDMT_bufferPool **)((long)pZVar10 + lVar17 + -0x50) = mtctx->bufPool;
            *(ZSTDMT_seqPool **)((long)pZVar10 + lVar17 + -0x48) = mtctx->seqPool;
            *(serialState_t **)((long)pZVar10 + lVar17 + -0x40) = &mtctx->serial;
            *(int *)((long)pZVar10 + lVar17 + -8) = (int)uVar7;
            *(uint *)((long)pZVar10 + lVar17 + -4) = (uint)(uVar7 == 0);
            *(uint *)((long)&pZVar10->consumed + lVar17) = (uint)(uVar22 - 1 == uVar7);
            POOL_add(mtctx->factory,ZSTDMT_compressionJob,(void *)(lVar17 + -0xc0 + (long)pZVar10));
            lVar13 = lVar13 + uVar25;
            lVar19 = lVar19 + sVar24;
            sVar21 = sVar21 - uVar25;
            uVar7 = uVar7 + 1;
            lVar17 = lVar17 + 0x178;
          } while (uVar23 != uVar7);
          uVar8 = 0;
          uVar26 = 0;
          uVar25 = 0;
          do {
            pthread_mutex_lock((pthread_mutex_t *)&mtctx->jobs[uVar8].job_mutex);
            pZVar10 = mtctx->jobs;
            if (pZVar10[uVar8].consumed < pZVar10[uVar8].src.size) {
              do {
                pthread_cond_wait((pthread_cond_t *)&pZVar10[uVar8].job_cond,
                                  (pthread_mutex_t *)&pZVar10[uVar8].job_mutex);
                pZVar10 = mtctx->jobs;
              } while (pZVar10[uVar8].consumed < pZVar10[uVar8].src.size);
            }
            pthread_mutex_unlock((pthread_mutex_t *)&pZVar10[uVar8].job_mutex);
            __n = mtctx->jobs[uVar8].cSize;
            uVar16 = uVar26;
            if (0xffffffffffffff88 < __n) {
              uVar16 = __n;
            }
            uVar7 = __n + uVar25;
            uVar26 = 0;
            if (dstCapacity < uVar7) {
              uVar26 = 0xffffffffffffffba;
            }
            if (uVar16 != 0) {
              uVar26 = uVar16;
            }
            if (uVar8 != 0) {
              if (uVar26 == 0) {
                memmove((void *)(uVar25 + (long)dst),mtctx->jobs[uVar8].dstBuff.start,__n);
              }
              if ((uVar6 & 0xffffffff) <= uVar8) {
                buf.capacity = mtctx->jobs[uVar8].dstBuff.capacity;
                buf.start = mtctx->jobs[uVar8].dstBuff.start;
                ZSTDMT_releaseBuffer(mtctx->bufPool,buf);
              }
            }
            pbVar9 = &mtctx->jobs[uVar8].dstBuff;
            pbVar9->start = (void *)0x0;
            pbVar9->capacity = 0;
            mtctx->jobs[uVar8].cSize = 0;
            uVar8 = uVar8 + 1;
            uVar25 = uVar7;
          } while (uVar8 != uVar23);
        }
        if (params.fParams.checksumFlag != 0) {
          if (dstCapacity < uVar7 + 4) {
            uVar26 = 0xffffffffffffffba;
          }
          else {
            uVar11 = ZSTD_XXH64_digest(&(mtctx->serial).xxhState);
            *(int *)((long)dst + uVar7) = (int)uVar11;
            uVar7 = uVar7 + 4;
          }
        }
        if (uVar26 != 0) {
          uVar7 = uVar26;
        }
      }
    }
    return uVar7;
  }
  __assert_fail("jobParams.nbWorkers == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x4f4d,
                "size_t ZSTDMT_compress_advanced_internal(ZSTDMT_CCtx *, void *, size_t, const void *, size_t, const ZSTD_CDict *, ZSTD_CCtx_params)"
               );
}

Assistant:

static size_t ZSTDMT_compress_advanced_internal(
                ZSTDMT_CCtx* mtctx,
                void* dst, size_t dstCapacity,
          const void* src, size_t srcSize,
          const ZSTD_CDict* cdict,
                ZSTD_CCtx_params params)
{
    ZSTD_CCtx_params const jobParams = ZSTDMT_initJobCCtxParams(&params);
    size_t const overlapSize = ZSTDMT_computeOverlapSize(&params);
    unsigned const nbJobs = ZSTDMT_computeNbJobs(&params, srcSize, params.nbWorkers);
    size_t const proposedJobSize = (srcSize + (nbJobs-1)) / nbJobs;
    size_t const avgJobSize = (((proposedJobSize-1) & 0x1FFFF) < 0x7FFF) ? proposedJobSize + 0xFFFF : proposedJobSize;   /* avoid too small last block */
    const char* const srcStart = (const char*)src;
    size_t remainingSrcSize = srcSize;
    unsigned const compressWithinDst = (dstCapacity >= ZSTD_compressBound(srcSize)) ? nbJobs : (unsigned)(dstCapacity / ZSTD_compressBound(avgJobSize));  /* presumes avgJobSize >= 256 KB, which should be the case */
    size_t frameStartPos = 0, dstBufferPos = 0;
    assert(jobParams.nbWorkers == 0);
    assert(mtctx->cctxPool->totalCCtx == params.nbWorkers);

    params.jobSize = (U32)avgJobSize;
    DEBUGLOG(4, "ZSTDMT_compress_advanced_internal: nbJobs=%2u (rawSize=%u bytes; fixedSize=%u) ",
                nbJobs, (U32)proposedJobSize, (U32)avgJobSize);

    if ((nbJobs==1) | (params.nbWorkers<=1)) {   /* fallback to single-thread mode : this is a blocking invocation anyway */
        ZSTD_CCtx* const cctx = mtctx->cctxPool->cctx[0];
        DEBUGLOG(4, "ZSTDMT_compress_advanced_internal: fallback to single-thread mode");
        if (cdict) return ZSTD_compress_usingCDict_advanced(cctx, dst, dstCapacity, src, srcSize, cdict, jobParams.fParams);
        return ZSTD_compress_advanced_internal(cctx, dst, dstCapacity, src, srcSize, NULL, 0, &jobParams);
    }

    assert(avgJobSize >= 256 KB);  /* condition for ZSTD_compressBound(A) + ZSTD_compressBound(B) <= ZSTD_compressBound(A+B), required to compress directly into Dst (no additional buffer) */
    ZSTDMT_setBufferSize(mtctx->bufPool, ZSTD_compressBound(avgJobSize) );
    if (ZSTDMT_serialState_reset(&mtctx->serial, mtctx->seqPool, params, avgJobSize, NULL, 0))
        return ERROR(memory_allocation);

    FORWARD_IF_ERROR( ZSTDMT_expandJobsTable(mtctx, nbJobs) );  /* only expands if necessary */

    {   unsigned u;
        for (u=0; u<nbJobs; u++) {
            size_t const jobSize = MIN(remainingSrcSize, avgJobSize);
            size_t const dstBufferCapacity = ZSTD_compressBound(jobSize);
            buffer_t const dstAsBuffer = { (char*)dst + dstBufferPos, dstBufferCapacity };
            buffer_t const dstBuffer = u < compressWithinDst ? dstAsBuffer : g_nullBuffer;
            size_t dictSize = u ? overlapSize : 0;

            mtctx->jobs[u].prefix.start = srcStart + frameStartPos - dictSize;
            mtctx->jobs[u].prefix.size = dictSize;
            mtctx->jobs[u].src.start = srcStart + frameStartPos;
            mtctx->jobs[u].src.size = jobSize; assert(jobSize > 0);  /* avoid job.src.size == 0 */
            mtctx->jobs[u].consumed = 0;
            mtctx->jobs[u].cSize = 0;
            mtctx->jobs[u].cdict = (u==0) ? cdict : NULL;
            mtctx->jobs[u].fullFrameSize = srcSize;
            mtctx->jobs[u].params = jobParams;
            /* do not calculate checksum within sections, but write it in header for first section */
            mtctx->jobs[u].dstBuff = dstBuffer;
            mtctx->jobs[u].cctxPool = mtctx->cctxPool;
            mtctx->jobs[u].bufPool = mtctx->bufPool;
            mtctx->jobs[u].seqPool = mtctx->seqPool;
            mtctx->jobs[u].serial = &mtctx->serial;
            mtctx->jobs[u].jobID = u;
            mtctx->jobs[u].firstJob = (u==0);
            mtctx->jobs[u].lastJob = (u==nbJobs-1);

            DEBUGLOG(5, "ZSTDMT_compress_advanced_internal: posting job %u  (%u bytes)", u, (U32)jobSize);
            DEBUG_PRINTHEX(6, mtctx->jobs[u].prefix.start, 12);
            POOL_add(mtctx->factory, ZSTDMT_compressionJob, &mtctx->jobs[u]);

            frameStartPos += jobSize;
            dstBufferPos += dstBufferCapacity;
            remainingSrcSize -= jobSize;
    }   }

    /* collect result */
    {   size_t error = 0, dstPos = 0;
        unsigned jobID;
        for (jobID=0; jobID<nbJobs; jobID++) {
            DEBUGLOG(5, "waiting for job %u ", jobID);
            ZSTD_PTHREAD_MUTEX_LOCK(&mtctx->jobs[jobID].job_mutex);
            while (mtctx->jobs[jobID].consumed < mtctx->jobs[jobID].src.size) {
                DEBUGLOG(5, "waiting for jobCompleted signal from job %u", jobID);
                ZSTD_pthread_cond_wait(&mtctx->jobs[jobID].job_cond, &mtctx->jobs[jobID].job_mutex);
            }
            ZSTD_pthread_mutex_unlock(&mtctx->jobs[jobID].job_mutex);
            DEBUGLOG(5, "ready to write job %u ", jobID);

            {   size_t const cSize = mtctx->jobs[jobID].cSize;
                if (ZSTD_isError(cSize)) error = cSize;
                if ((!error) && (dstPos + cSize > dstCapacity)) error = ERROR(dstSize_tooSmall);
                if (jobID) {   /* note : job 0 is written directly at dst, which is correct position */
                    if (!error)
                        memmove((char*)dst + dstPos, mtctx->jobs[jobID].dstBuff.start, cSize);  /* may overlap when job compressed within dst */
                    if (jobID >= compressWithinDst) {  /* job compressed into its own buffer, which must be released */
                        DEBUGLOG(5, "releasing buffer %u>=%u", jobID, compressWithinDst);
                        ZSTDMT_releaseBuffer(mtctx->bufPool, mtctx->jobs[jobID].dstBuff);
                }   }
                mtctx->jobs[jobID].dstBuff = g_nullBuffer;
                mtctx->jobs[jobID].cSize = 0;
                dstPos += cSize ;
            }
        }  /* for (jobID=0; jobID<nbJobs; jobID++) */

        DEBUGLOG(4, "checksumFlag : %u ", params.fParams.checksumFlag);
        if (params.fParams.checksumFlag) {
            U32 const checksum = (U32)XXH64_digest(&mtctx->serial.xxhState);
            if (dstPos + 4 > dstCapacity) {
                error = ERROR(dstSize_tooSmall);
            } else {
                DEBUGLOG(4, "writing checksum : %08X \n", checksum);
                MEM_writeLE32((char*)dst + dstPos, checksum);
                dstPos += 4;
        }   }

        if (!error) DEBUGLOG(4, "compressed size : %u  ", (U32)dstPos);
        return error ? error : dstPos;
    }
}